

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_grammar(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos123;
  int yypos123;
  int yythunkpos121;
  int yypos121;
  int yythunkpos118;
  int yypos118;
  int yythunkpos119;
  int yypos119;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = yy__(G);
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar3 = G->thunkpos;
    iVar6 = yy_declaration(G);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
      iVar5 = yy_definition(G);
      if (iVar5 == 0) goto LAB_001026dd;
    }
    do {
      do {
        iVar5 = G->pos;
        iVar3 = G->thunkpos;
        iVar6 = G->pos;
        iVar4 = G->thunkpos;
        iVar7 = yy_declaration(G);
      } while (iVar7 != 0);
      G->pos = iVar6;
      G->thunkpos = iVar4;
      iVar6 = yy_definition(G);
    } while (iVar6 != 0);
    G->pos = iVar5;
    G->thunkpos = iVar3;
    iVar5 = G->pos;
    iVar3 = G->thunkpos;
    iVar6 = yy_trailer(G);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
    }
    iVar5 = yy_end_of_file(G);
    if (iVar5 != 0) {
      return 1;
    }
  }
LAB_001026dd:
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_grammar(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "grammar"));
  if (!yy__(G))  goto l116;

  {  int yypos119= G->pos, yythunkpos119= G->thunkpos;  if (!yy_declaration(G))  goto l120;
  goto l119;
  l120:;	  G->pos= yypos119; G->thunkpos= yythunkpos119;  if (!yy_definition(G))  goto l116;

  }
  l119:;	
  l117:;	
  {  int yypos118= G->pos, yythunkpos118= G->thunkpos;
  {  int yypos121= G->pos, yythunkpos121= G->thunkpos;  if (!yy_declaration(G))  goto l122;
  goto l121;
  l122:;	  G->pos= yypos121; G->thunkpos= yythunkpos121;  if (!yy_definition(G))  goto l118;

  }
  l121:;	  goto l117;
  l118:;	  G->pos= yypos118; G->thunkpos= yythunkpos118;
  }
  {  int yypos123= G->pos, yythunkpos123= G->thunkpos;  if (!yy_trailer(G))  goto l123;
  goto l124;
  l123:;	  G->pos= yypos123; G->thunkpos= yythunkpos123;
  }
  l124:;	  if (!yy_end_of_file(G))  goto l116;
  yyprintf((stderr, "  ok   grammar"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l116:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "grammar"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}